

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcCreateCnf(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Vec_Wec_t *p_00;
  Aig_Man_t *pAVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p_01;
  Aig_Obj_t *pAVar4;
  int local_4c;
  int Value;
  int i;
  int f;
  int Lit;
  Aig_Obj_t *pTemp;
  Vec_Int_t *vVisit2;
  Vec_Int_t *vVisit;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Gia_ManBmc_t *p_local;
  
  iVar2 = Saig_ManBmcRunTerSim_rec(p,pObj,iFrame);
  if (iVar2 == 3) {
    Vec_WecClear(p->vVisited);
    pVVar3 = Vec_WecPushLevel(p->vVisited);
    iVar2 = Aig_ObjId(pObj);
    Vec_IntPush(pVVar3,iVar2);
    for (Value = iFrame; -1 < Value; Value = Value + -1) {
      Aig_ManIncrementTravId(p->pAig);
      pVVar3 = Vec_WecPushLevel(p->vVisited);
      p_00 = p->vVisited;
      iVar2 = Vec_WecSize(p->vVisited);
      p_01 = Vec_WecEntry(p_00,iVar2 + -2);
      for (local_4c = 0; iVar2 = Vec_IntSize(p_01), local_4c < iVar2; local_4c = local_4c + 1) {
        pAVar1 = p->pAig;
        iVar2 = Vec_IntEntry(p_01,local_4c);
        pAVar4 = Aig_ManObj(pAVar1,iVar2);
        Saig_ManBmcCreateCnf_iter(p,pAVar4,Value,pVVar3);
      }
      iVar2 = Vec_IntSize(pVVar3);
      if (iVar2 == 0) break;
    }
    Value = Vec_WecSize(p->vVisited);
    while (Value = Value + -1, -1 < Value) {
      pVVar3 = Vec_WecEntry(p->vVisited,Value);
      for (local_4c = 0; iVar2 = Vec_IntSize(pVVar3), local_4c < iVar2; local_4c = local_4c + 1) {
        pAVar1 = p->pAig;
        iVar2 = Vec_IntEntry(pVVar3,local_4c);
        pAVar4 = Aig_ManObj(pAVar1,iVar2);
        Saig_ManBmcCreateCnf_rec(p,pAVar4,iFrame - Value);
      }
    }
    p_local._4_4_ = Saig_ManBmcLiteral(p,pObj,iFrame);
    if (p->pSat2 == (satoko_t *)0x0) {
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        sat_solver_setnvars(p->pSat,p->nSatVars);
      }
      else {
        for (local_4c = bmcg_sat_solver_varnum(p->pSat3); local_4c < p->nSatVars;
            local_4c = local_4c + 1) {
          bmcg_sat_solver_addvar(p->pSat3);
        }
      }
    }
    else {
      satoko_setnvars(p->pSat2,p->nSatVars);
    }
  }
  else {
    p_local._4_4_ = (uint)(iVar2 == 2);
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManBmcCreateCnf( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    Vec_Int_t * vVisit, * vVisit2;
    Aig_Obj_t * pTemp;
    int Lit, f, i;
    // perform ternary simulation
    int Value = Saig_ManBmcRunTerSim_rec( p, pObj, iFrame );
    if ( Value != SAIG_TER_UND )
        return (int)(Value == SAIG_TER_ONE);
    // construct CNF if value is ternary
//    Lit = Saig_ManBmcCreateCnf_rec( p, pObj, iFrame );
    Vec_WecClear( p->vVisited );
    vVisit = Vec_WecPushLevel( p->vVisited );
    Vec_IntPush( vVisit, Aig_ObjId(pObj) );
    for ( f = iFrame; f >= 0; f-- )
    {
        Aig_ManIncrementTravId( p->pAig );
        vVisit2 = Vec_WecPushLevel( p->vVisited );
        vVisit = Vec_WecEntry( p->vVisited, Vec_WecSize(p->vVisited)-2 );
        Aig_ManForEachObjVec( vVisit, p->pAig, pTemp, i )
            Saig_ManBmcCreateCnf_iter( p, pTemp, f, vVisit2 );
        if ( Vec_IntSize(vVisit2) == 0 )
            break;
    }
    Vec_WecForEachLevelReverse( p->vVisited, vVisit, f )
        Aig_ManForEachObjVec( vVisit, p->pAig, pTemp, i )
            Saig_ManBmcCreateCnf_rec( p, pTemp, iFrame-f );
    Lit = Saig_ManBmcLiteral( p, pObj, iFrame );
    // extend the SAT solver
    if ( p->pSat2 )
        satoko_setnvars( p->pSat2, p->nSatVars );
    else if ( p->pSat3 )
    {
        for ( i = bmcg_sat_solver_varnum(p->pSat3); i < p->nSatVars; i++ )
            bmcg_sat_solver_addvar( p->pSat3 );
    }
    else
        sat_solver_setnvars( p->pSat, p->nSatVars );
    return Lit;
}